

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O0

AnalogConsumer_python * __thiscall
PythonModuleClient::subanalogdata_python(PythonModuleClient *this,size_t buffersize,list *l)

{
  AnalogConsumer_python *this_00;
  undefined4 in_ESI;
  HighFreqDataType *in_RDI;
  HFSubSockSettings sockinfo;
  AnalogConsumer_python *newsub;
  HFParsingInfo parseinfo;
  HighFreqDataType dt;
  HighFreqSub *in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  AnalogConsumer_python *foo;
  allocator *this_01;
  SubType type;
  HFSubSockSettings *this_02;
  HighFreqDataType *obj;
  HighFreqDataType *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffc08;
  string *in_stack_fffffffffffffc10;
  network_pimpl *in_stack_fffffffffffffc18;
  list *in_stack_fffffffffffffc58;
  HFSubSockSettings *in_stack_fffffffffffffc90;
  MlmWrap *in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffca4;
  HighFreqDataType *in_stack_fffffffffffffca8;
  AnalogConsumer_python *in_stack_fffffffffffffcb0;
  string local_180 [127];
  allocator local_101;
  string local_100 [55];
  undefined1 local_c9 [145];
  string *in_stack_ffffffffffffffc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd0;
  MlmWrap *in_stack_ffffffffffffffd8;
  
  this_02 = *(HFSubSockSettings **)&in_RDI->origin;
  obj = (HighFreqDataType *)local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_c9 + 1),"analogstream",(allocator *)obj);
  this_01 = &local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"Trodes",this_01);
  network_pimpl::find_hfdt
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string((string *)(local_c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_c9);
  listToVec<std::__cxx11::string>(in_stack_fffffffffffffc58);
  HighFreqDataType::getDataFormat_abi_cxx11_((HighFreqDataType *)in_stack_fffffffffffffb88);
  MlmWrap::createAnalogParsingInfo
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  type = (SubType)((ulong)this_01 >> 0x20);
  this_00 = (AnalogConsumer_python *)operator_new(0x480);
  HighFreqDataType::HighFreqDataType(in_stack_fffffffffffffbc0,obj);
  HFParsingInfo::HFParsingInfo((HFParsingInfo *)this_02,(HFParsingInfo *)in_RDI);
  AnalogConsumer_python::AnalogConsumer_python
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,
             (HFParsingInfo *)in_stack_fffffffffffffc98);
  HFParsingInfo::~HFParsingInfo((HFParsingInfo *)CONCAT44(in_ESI,in_stack_fffffffffffffb90));
  HighFreqDataType::~HighFreqDataType
            ((HighFreqDataType *)CONCAT44(in_ESI,in_stack_fffffffffffffb90));
  foo = this_00;
  HighFreqDataType::HighFreqDataType(in_stack_fffffffffffffbc0,obj);
  HighFreqSub::getSubSockType((HighFreqSub *)this_00);
  HFSubSockSettings::HFSubSockSettings
            (this_02,in_RDI,type,(hfs_data_callback_fn)foo,
             (void *)CONCAT44(in_ESI,in_stack_fffffffffffffb90));
  HighFreqDataType::~HighFreqDataType
            ((HighFreqDataType *)CONCAT44(in_ESI,in_stack_fffffffffffffb90));
  MlmWrap::addSubToList
            ((MlmWrap *)CONCAT44(in_ESI,in_stack_fffffffffffffb90),in_stack_fffffffffffffb88);
  HFSubSockSettings::HFSubSockSettings
            ((HFSubSockSettings *)CONCAT44(in_ESI,in_stack_fffffffffffffb90),
             (HFSubSockSettings *)in_stack_fffffffffffffb88);
  MlmWrap::addHfTypeToSubbedList(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x3975b9);
  HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x3975d2);
  HFParsingInfo::~HFParsingInfo((HFParsingInfo *)CONCAT44(in_ESI,in_stack_fffffffffffffb90));
  HighFreqDataType::~HighFreqDataType
            ((HighFreqDataType *)CONCAT44(in_ESI,in_stack_fffffffffffffb90));
  return this_00;
}

Assistant:

AnalogConsumer_python* subanalogdata_python(size_t buffersize, list& l){
        HighFreqDataType dt = state->find_hfdt(hfType_ANALOG, TRODES_NETWORK_ID);
        HFParsingInfo parseinfo = createAnalogParsingInfo(listToVec<std::string>(l), dt.getDataFormat());
        AnalogConsumer_python* newsub = new AnalogConsumer_python(dt, buffersize, parseinfo);
        HFSubSockSettings sockinfo(dt, newsub->getSubSockType(), NULL, NULL);
        addSubToList(newsub);
        addHfTypeToSubbedList(sockinfo);
        return newsub;
    }